

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcspn.c
# Opt level: O0

size_t strcspn(char *__s,char *__reject)

{
  char cVar1;
  char *local_30;
  char *p;
  size_t len;
  char *s2_local;
  char *s1_local;
  
  p = (char *)0x0;
  do {
    local_30 = __reject;
    if (__s[(long)p] == '\0') {
      return (size_t)p;
    }
    while (*local_30 != '\0') {
      cVar1 = *local_30;
      local_30 = local_30 + 1;
      if (__s[(long)p] == cVar1) {
        return (size_t)p;
      }
    }
    p = p + 1;
  } while( true );
}

Assistant:

size_t strcspn( const char * s1, const char * s2 )
{
    size_t len = 0;
    const char * p;

    while ( s1[len] )
    {
        p = s2;

        while ( *p )
        {
            if ( s1[len] == *p++ )
            {
                return len;
            }
        }

        ++len;
    }

    return len;
}